

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_exception_handler_test.cpp
# Opt level: O1

void __thiscall
StdExceptionCatcher_Tests::Test_that_std_exception_catcher_with_differnt_fail_code_types_works::
test_method(Test_that_std_exception_catcher_with_differnt_fail_code_types_works *this)

{
  logic_error *this_00;
  GenericExceptionHandler<std::exception,_mittens::UnHandler<bool>,_mittens::DefaultNoAction<std::exception>_>
  catcher;
  
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"std::exception!");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

BOOST_AUTO_TEST_CASE(Test_that_std_exception_catcher_with_differnt_fail_code_types_works)
{
   {
      auto catcher = std_exception_handler(false); // use bool fail code type

      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(false, catcher.handleException());
      }
   }

   {
      auto catcher = std_exception_handler(0.7); // use float fail code type

      try
      {
         throw_std_exception();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(0.7, catcher.handleException());
      }
   }
}